

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcm.c
# Opt level: O0

int mbedtls_gcm_self_test(int verbose)

{
  size_t sVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [11];
  undefined1 auVar11 [11];
  undefined1 auVar12 [11];
  undefined1 auVar13 [11];
  undefined1 auVar14 [12];
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  undefined1 auVar18 [13];
  undefined1 auVar19 [13];
  undefined1 auVar20 [13];
  undefined1 auVar21 [13];
  undefined1 auVar22 [14];
  undefined1 auVar23 [14];
  undefined1 auVar24 [14];
  undefined1 auVar25 [14];
  uint keybits;
  int iVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  char cVar32;
  char cVar33;
  char cVar34;
  char cVar35;
  char cVar36;
  char cVar37;
  char cVar38;
  char cVar39;
  char cVar40;
  char cVar41;
  byte bVar42;
  size_t rest_len_1;
  size_t rest_len;
  int key_len;
  mbedtls_cipher_id_t cipher;
  int ret;
  int j;
  int i;
  uchar tag_buf [16];
  uchar buf [64];
  mbedtls_gcm_context ctx;
  int verbose_local;
  
  mbedtls_gcm_init((mbedtls_gcm_context *)(buf + 0x38));
  cipher = MBEDTLS_CIPHER_ID_NONE;
  do {
    if (2 < (int)cipher) {
      if (verbose != 0) {
        printf(anon_var_dwarf_b755 + 8);
      }
      return 0;
    }
    keybits = cipher * 0x40 + 0x80;
    for (ret = 0; ret < 6; ret = ret + 1) {
      if (verbose != 0) {
        printf("  AES-GCM-%3d #%d (%s): ",(ulong)keybits,(ulong)(uint)ret,"enc");
      }
      mbedtls_gcm_setkey((mbedtls_gcm_context *)(buf + 0x38),MBEDTLS_CIPHER_ID_AES,
                         key[key_index[ret]],keybits);
      iVar26 = mbedtls_gcm_crypt_and_tag
                         ((mbedtls_gcm_context *)(buf + 0x38),1,pt_len[ret],iv[iv_index[ret]],
                          iv_len[ret],additional[add_index[ret]],add_len[ret],pt[pt_index[ret]],
                          tag_buf + 8,0x10,(uchar *)&j);
      if ((iVar26 != 0) ||
         (iVar26 = memcmp(tag_buf + 8,ct + (int)(cipher * 6 + ret),pt_len[ret]), iVar26 != 0)) {
LAB_0013d88d:
        if (verbose != 0) {
          printf("failed\n");
        }
        return 1;
      }
      iVar26 = cipher * 6 + ret;
      cVar27 = -((uchar)j == tag[iVar26][0]);
      cVar28 = -(j._1_1_ == tag[iVar26][1]);
      cVar29 = -(j._2_1_ == tag[iVar26][2]);
      cVar30 = -(j._3_1_ == tag[iVar26][3]);
      cVar31 = -((uchar)i == tag[iVar26][4]);
      cVar32 = -(i._1_1_ == tag[iVar26][5]);
      cVar33 = -(i._2_1_ == tag[iVar26][6]);
      cVar34 = -(i._3_1_ == tag[iVar26][7]);
      cVar35 = -(tag_buf[0] == tag[iVar26][8]);
      cVar36 = -(tag_buf[1] == tag[iVar26][9]);
      cVar37 = -(tag_buf[2] == tag[iVar26][10]);
      cVar38 = -(tag_buf[3] == tag[iVar26][0xb]);
      cVar39 = -(tag_buf[4] == tag[iVar26][0xc]);
      cVar40 = -(tag_buf[5] == tag[iVar26][0xd]);
      cVar41 = -(tag_buf[6] == tag[iVar26][0xe]);
      bVar42 = -(tag_buf[7] == tag[iVar26][0xf]);
      auVar2[1] = cVar28;
      auVar2[0] = cVar27;
      auVar2[2] = cVar29;
      auVar2[3] = cVar30;
      auVar2[4] = cVar31;
      auVar2[5] = cVar32;
      auVar2[6] = cVar33;
      auVar2[7] = cVar34;
      auVar2[8] = cVar35;
      auVar2[9] = cVar36;
      auVar2[10] = cVar37;
      auVar2[0xb] = cVar38;
      auVar2[0xc] = cVar39;
      auVar2[0xd] = cVar40;
      auVar2[0xe] = cVar41;
      auVar2[0xf] = bVar42;
      auVar3[1] = cVar28;
      auVar3[0] = cVar27;
      auVar3[2] = cVar29;
      auVar3[3] = cVar30;
      auVar3[4] = cVar31;
      auVar3[5] = cVar32;
      auVar3[6] = cVar33;
      auVar3[7] = cVar34;
      auVar3[8] = cVar35;
      auVar3[9] = cVar36;
      auVar3[10] = cVar37;
      auVar3[0xb] = cVar38;
      auVar3[0xc] = cVar39;
      auVar3[0xd] = cVar40;
      auVar3[0xe] = cVar41;
      auVar3[0xf] = bVar42;
      auVar22[1] = cVar30;
      auVar22[0] = cVar29;
      auVar22[2] = cVar31;
      auVar22[3] = cVar32;
      auVar22[4] = cVar33;
      auVar22[5] = cVar34;
      auVar22[6] = cVar35;
      auVar22[7] = cVar36;
      auVar22[8] = cVar37;
      auVar22[9] = cVar38;
      auVar22[10] = cVar39;
      auVar22[0xb] = cVar40;
      auVar22[0xc] = cVar41;
      auVar22[0xd] = bVar42;
      auVar18[1] = cVar31;
      auVar18[0] = cVar30;
      auVar18[2] = cVar32;
      auVar18[3] = cVar33;
      auVar18[4] = cVar34;
      auVar18[5] = cVar35;
      auVar18[6] = cVar36;
      auVar18[7] = cVar37;
      auVar18[8] = cVar38;
      auVar18[9] = cVar39;
      auVar18[10] = cVar40;
      auVar18[0xb] = cVar41;
      auVar18[0xc] = bVar42;
      auVar14[1] = cVar32;
      auVar14[0] = cVar31;
      auVar14[2] = cVar33;
      auVar14[3] = cVar34;
      auVar14[4] = cVar35;
      auVar14[5] = cVar36;
      auVar14[6] = cVar37;
      auVar14[7] = cVar38;
      auVar14[8] = cVar39;
      auVar14[9] = cVar40;
      auVar14[10] = cVar41;
      auVar14[0xb] = bVar42;
      auVar10[1] = cVar33;
      auVar10[0] = cVar32;
      auVar10[2] = cVar34;
      auVar10[3] = cVar35;
      auVar10[4] = cVar36;
      auVar10[5] = cVar37;
      auVar10[6] = cVar38;
      auVar10[7] = cVar39;
      auVar10[8] = cVar40;
      auVar10[9] = cVar41;
      auVar10[10] = bVar42;
      if ((ushort)((ushort)(SUB161(auVar2 >> 7,0) & 1) | (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB141(auVar22 >> 7,0) & 1) << 2 |
                   (ushort)(SUB131(auVar18 >> 7,0) & 1) << 3 |
                   (ushort)(SUB121(auVar14 >> 7,0) & 1) << 4 |
                   (ushort)(SUB111(auVar10 >> 7,0) & 1) << 5 |
                   (ushort)((byte)(CONCAT19(bVar42,CONCAT18(cVar41,CONCAT17(cVar40,CONCAT16(cVar39,
                                                  CONCAT15(cVar38,CONCAT14(cVar37,CONCAT13(cVar36,
                                                  CONCAT12(cVar35,CONCAT11(cVar34,cVar33))))))))) >>
                                  7) & 1) << 6 |
                   (ushort)((byte)(CONCAT18(bVar42,CONCAT17(cVar41,CONCAT16(cVar40,CONCAT15(cVar39,
                                                  CONCAT14(cVar38,CONCAT13(cVar37,CONCAT12(cVar36,
                                                  CONCAT11(cVar35,cVar34)))))))) >> 7) & 1) << 7 |
                  (ushort)(bVar42 >> 7) << 0xf) != 0xffff) goto LAB_0013d88d;
      mbedtls_gcm_free((mbedtls_gcm_context *)(buf + 0x38));
      if (verbose != 0) {
        printf("passed\n");
        printf("  AES-GCM-%3d #%d (%s): ",(ulong)keybits,(ulong)(uint)ret,"dec");
      }
      mbedtls_gcm_setkey((mbedtls_gcm_context *)(buf + 0x38),MBEDTLS_CIPHER_ID_AES,
                         key[key_index[ret]],keybits);
      iVar26 = mbedtls_gcm_crypt_and_tag
                         ((mbedtls_gcm_context *)(buf + 0x38),0,pt_len[ret],iv[iv_index[ret]],
                          iv_len[ret],additional[add_index[ret]],add_len[ret],
                          ct[(int)(cipher * 6 + ret)],tag_buf + 8,0x10,(uchar *)&j);
      if ((iVar26 != 0) ||
         (iVar26 = memcmp(tag_buf + 8,pt + pt_index[ret],pt_len[ret]), iVar26 != 0)) {
LAB_0013da90:
        if (verbose != 0) {
          printf("failed\n");
        }
        return 1;
      }
      iVar26 = cipher * 6 + ret;
      cVar27 = -((uchar)j == tag[iVar26][0]);
      cVar28 = -(j._1_1_ == tag[iVar26][1]);
      cVar29 = -(j._2_1_ == tag[iVar26][2]);
      cVar30 = -(j._3_1_ == tag[iVar26][3]);
      cVar31 = -((uchar)i == tag[iVar26][4]);
      cVar32 = -(i._1_1_ == tag[iVar26][5]);
      cVar33 = -(i._2_1_ == tag[iVar26][6]);
      cVar34 = -(i._3_1_ == tag[iVar26][7]);
      cVar35 = -(tag_buf[0] == tag[iVar26][8]);
      cVar36 = -(tag_buf[1] == tag[iVar26][9]);
      cVar37 = -(tag_buf[2] == tag[iVar26][10]);
      cVar38 = -(tag_buf[3] == tag[iVar26][0xb]);
      cVar39 = -(tag_buf[4] == tag[iVar26][0xc]);
      cVar40 = -(tag_buf[5] == tag[iVar26][0xd]);
      cVar41 = -(tag_buf[6] == tag[iVar26][0xe]);
      bVar42 = -(tag_buf[7] == tag[iVar26][0xf]);
      auVar4[1] = cVar28;
      auVar4[0] = cVar27;
      auVar4[2] = cVar29;
      auVar4[3] = cVar30;
      auVar4[4] = cVar31;
      auVar4[5] = cVar32;
      auVar4[6] = cVar33;
      auVar4[7] = cVar34;
      auVar4[8] = cVar35;
      auVar4[9] = cVar36;
      auVar4[10] = cVar37;
      auVar4[0xb] = cVar38;
      auVar4[0xc] = cVar39;
      auVar4[0xd] = cVar40;
      auVar4[0xe] = cVar41;
      auVar4[0xf] = bVar42;
      auVar5[1] = cVar28;
      auVar5[0] = cVar27;
      auVar5[2] = cVar29;
      auVar5[3] = cVar30;
      auVar5[4] = cVar31;
      auVar5[5] = cVar32;
      auVar5[6] = cVar33;
      auVar5[7] = cVar34;
      auVar5[8] = cVar35;
      auVar5[9] = cVar36;
      auVar5[10] = cVar37;
      auVar5[0xb] = cVar38;
      auVar5[0xc] = cVar39;
      auVar5[0xd] = cVar40;
      auVar5[0xe] = cVar41;
      auVar5[0xf] = bVar42;
      auVar23[1] = cVar30;
      auVar23[0] = cVar29;
      auVar23[2] = cVar31;
      auVar23[3] = cVar32;
      auVar23[4] = cVar33;
      auVar23[5] = cVar34;
      auVar23[6] = cVar35;
      auVar23[7] = cVar36;
      auVar23[8] = cVar37;
      auVar23[9] = cVar38;
      auVar23[10] = cVar39;
      auVar23[0xb] = cVar40;
      auVar23[0xc] = cVar41;
      auVar23[0xd] = bVar42;
      auVar19[1] = cVar31;
      auVar19[0] = cVar30;
      auVar19[2] = cVar32;
      auVar19[3] = cVar33;
      auVar19[4] = cVar34;
      auVar19[5] = cVar35;
      auVar19[6] = cVar36;
      auVar19[7] = cVar37;
      auVar19[8] = cVar38;
      auVar19[9] = cVar39;
      auVar19[10] = cVar40;
      auVar19[0xb] = cVar41;
      auVar19[0xc] = bVar42;
      auVar15[1] = cVar32;
      auVar15[0] = cVar31;
      auVar15[2] = cVar33;
      auVar15[3] = cVar34;
      auVar15[4] = cVar35;
      auVar15[5] = cVar36;
      auVar15[6] = cVar37;
      auVar15[7] = cVar38;
      auVar15[8] = cVar39;
      auVar15[9] = cVar40;
      auVar15[10] = cVar41;
      auVar15[0xb] = bVar42;
      auVar11[1] = cVar33;
      auVar11[0] = cVar32;
      auVar11[2] = cVar34;
      auVar11[3] = cVar35;
      auVar11[4] = cVar36;
      auVar11[5] = cVar37;
      auVar11[6] = cVar38;
      auVar11[7] = cVar39;
      auVar11[8] = cVar40;
      auVar11[9] = cVar41;
      auVar11[10] = bVar42;
      if ((ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) | (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB141(auVar23 >> 7,0) & 1) << 2 |
                   (ushort)(SUB131(auVar19 >> 7,0) & 1) << 3 |
                   (ushort)(SUB121(auVar15 >> 7,0) & 1) << 4 |
                   (ushort)(SUB111(auVar11 >> 7,0) & 1) << 5 |
                   (ushort)((byte)(CONCAT19(bVar42,CONCAT18(cVar41,CONCAT17(cVar40,CONCAT16(cVar39,
                                                  CONCAT15(cVar38,CONCAT14(cVar37,CONCAT13(cVar36,
                                                  CONCAT12(cVar35,CONCAT11(cVar34,cVar33))))))))) >>
                                  7) & 1) << 6 |
                   (ushort)((byte)(CONCAT18(bVar42,CONCAT17(cVar41,CONCAT16(cVar40,CONCAT15(cVar39,
                                                  CONCAT14(cVar38,CONCAT13(cVar37,CONCAT12(cVar36,
                                                  CONCAT11(cVar35,cVar34)))))))) >> 7) & 1) << 7 |
                  (ushort)(bVar42 >> 7) << 0xf) != 0xffff) goto LAB_0013da90;
      mbedtls_gcm_free((mbedtls_gcm_context *)(buf + 0x38));
      if (verbose != 0) {
        printf("passed\n");
        printf("  AES-GCM-%3d #%d split (%s): ",(ulong)keybits,(ulong)(uint)ret,"enc");
      }
      mbedtls_gcm_setkey((mbedtls_gcm_context *)(buf + 0x38),MBEDTLS_CIPHER_ID_AES,
                         key[key_index[ret]],keybits);
      iVar26 = mbedtls_gcm_starts((mbedtls_gcm_context *)(buf + 0x38),1,iv[iv_index[ret]],
                                  iv_len[ret],additional[add_index[ret]],add_len[ret]);
      if (iVar26 != 0) {
        if (verbose != 0) {
          printf("failed\n");
        }
        return 1;
      }
      if (pt_len[ret] < 0x21) {
        iVar26 = mbedtls_gcm_update((mbedtls_gcm_context *)(buf + 0x38),pt_len[ret],
                                    pt[pt_index[ret]],tag_buf + 8);
        if (iVar26 != 0) {
          if (verbose != 0) {
            printf("failed\n");
          }
          return 1;
        }
      }
      else {
        sVar1 = pt_len[ret];
        iVar26 = mbedtls_gcm_update((mbedtls_gcm_context *)(buf + 0x38),0x20,pt[pt_index[ret]],
                                    tag_buf + 8);
        if (iVar26 != 0) {
          if (verbose != 0) {
            printf("failed\n");
          }
          return 1;
        }
        iVar26 = mbedtls_gcm_update((mbedtls_gcm_context *)(buf + 0x38),sVar1 - 0x20,
                                    pt[pt_index[ret]] + 0x20,buf + 0x18);
        if (iVar26 != 0) {
          if (verbose != 0) {
            printf("failed\n");
          }
          return 1;
        }
      }
      iVar26 = mbedtls_gcm_finish((mbedtls_gcm_context *)(buf + 0x38),(uchar *)&j,0x10);
      if ((iVar26 != 0) ||
         (iVar26 = memcmp(tag_buf + 8,ct + (int)(cipher * 6 + ret),pt_len[ret]), iVar26 != 0)) {
LAB_0013de07:
        if (verbose != 0) {
          printf("failed\n");
        }
        return 1;
      }
      iVar26 = cipher * 6 + ret;
      cVar27 = -((uchar)j == tag[iVar26][0]);
      cVar28 = -(j._1_1_ == tag[iVar26][1]);
      cVar29 = -(j._2_1_ == tag[iVar26][2]);
      cVar30 = -(j._3_1_ == tag[iVar26][3]);
      cVar31 = -((uchar)i == tag[iVar26][4]);
      cVar32 = -(i._1_1_ == tag[iVar26][5]);
      cVar33 = -(i._2_1_ == tag[iVar26][6]);
      cVar34 = -(i._3_1_ == tag[iVar26][7]);
      cVar35 = -(tag_buf[0] == tag[iVar26][8]);
      cVar36 = -(tag_buf[1] == tag[iVar26][9]);
      cVar37 = -(tag_buf[2] == tag[iVar26][10]);
      cVar38 = -(tag_buf[3] == tag[iVar26][0xb]);
      cVar39 = -(tag_buf[4] == tag[iVar26][0xc]);
      cVar40 = -(tag_buf[5] == tag[iVar26][0xd]);
      cVar41 = -(tag_buf[6] == tag[iVar26][0xe]);
      bVar42 = -(tag_buf[7] == tag[iVar26][0xf]);
      auVar6[1] = cVar28;
      auVar6[0] = cVar27;
      auVar6[2] = cVar29;
      auVar6[3] = cVar30;
      auVar6[4] = cVar31;
      auVar6[5] = cVar32;
      auVar6[6] = cVar33;
      auVar6[7] = cVar34;
      auVar6[8] = cVar35;
      auVar6[9] = cVar36;
      auVar6[10] = cVar37;
      auVar6[0xb] = cVar38;
      auVar6[0xc] = cVar39;
      auVar6[0xd] = cVar40;
      auVar6[0xe] = cVar41;
      auVar6[0xf] = bVar42;
      auVar7[1] = cVar28;
      auVar7[0] = cVar27;
      auVar7[2] = cVar29;
      auVar7[3] = cVar30;
      auVar7[4] = cVar31;
      auVar7[5] = cVar32;
      auVar7[6] = cVar33;
      auVar7[7] = cVar34;
      auVar7[8] = cVar35;
      auVar7[9] = cVar36;
      auVar7[10] = cVar37;
      auVar7[0xb] = cVar38;
      auVar7[0xc] = cVar39;
      auVar7[0xd] = cVar40;
      auVar7[0xe] = cVar41;
      auVar7[0xf] = bVar42;
      auVar24[1] = cVar30;
      auVar24[0] = cVar29;
      auVar24[2] = cVar31;
      auVar24[3] = cVar32;
      auVar24[4] = cVar33;
      auVar24[5] = cVar34;
      auVar24[6] = cVar35;
      auVar24[7] = cVar36;
      auVar24[8] = cVar37;
      auVar24[9] = cVar38;
      auVar24[10] = cVar39;
      auVar24[0xb] = cVar40;
      auVar24[0xc] = cVar41;
      auVar24[0xd] = bVar42;
      auVar20[1] = cVar31;
      auVar20[0] = cVar30;
      auVar20[2] = cVar32;
      auVar20[3] = cVar33;
      auVar20[4] = cVar34;
      auVar20[5] = cVar35;
      auVar20[6] = cVar36;
      auVar20[7] = cVar37;
      auVar20[8] = cVar38;
      auVar20[9] = cVar39;
      auVar20[10] = cVar40;
      auVar20[0xb] = cVar41;
      auVar20[0xc] = bVar42;
      auVar16[1] = cVar32;
      auVar16[0] = cVar31;
      auVar16[2] = cVar33;
      auVar16[3] = cVar34;
      auVar16[4] = cVar35;
      auVar16[5] = cVar36;
      auVar16[6] = cVar37;
      auVar16[7] = cVar38;
      auVar16[8] = cVar39;
      auVar16[9] = cVar40;
      auVar16[10] = cVar41;
      auVar16[0xb] = bVar42;
      auVar12[1] = cVar33;
      auVar12[0] = cVar32;
      auVar12[2] = cVar34;
      auVar12[3] = cVar35;
      auVar12[4] = cVar36;
      auVar12[5] = cVar37;
      auVar12[6] = cVar38;
      auVar12[7] = cVar39;
      auVar12[8] = cVar40;
      auVar12[9] = cVar41;
      auVar12[10] = bVar42;
      if ((ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) | (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB141(auVar24 >> 7,0) & 1) << 2 |
                   (ushort)(SUB131(auVar20 >> 7,0) & 1) << 3 |
                   (ushort)(SUB121(auVar16 >> 7,0) & 1) << 4 |
                   (ushort)(SUB111(auVar12 >> 7,0) & 1) << 5 |
                   (ushort)((byte)(CONCAT19(bVar42,CONCAT18(cVar41,CONCAT17(cVar40,CONCAT16(cVar39,
                                                  CONCAT15(cVar38,CONCAT14(cVar37,CONCAT13(cVar36,
                                                  CONCAT12(cVar35,CONCAT11(cVar34,cVar33))))))))) >>
                                  7) & 1) << 6 |
                   (ushort)((byte)(CONCAT18(bVar42,CONCAT17(cVar41,CONCAT16(cVar40,CONCAT15(cVar39,
                                                  CONCAT14(cVar38,CONCAT13(cVar37,CONCAT12(cVar36,
                                                  CONCAT11(cVar35,cVar34)))))))) >> 7) & 1) << 7 |
                  (ushort)(bVar42 >> 7) << 0xf) != 0xffff) goto LAB_0013de07;
      mbedtls_gcm_free((mbedtls_gcm_context *)(buf + 0x38));
      if (verbose != 0) {
        printf("passed\n");
        printf("  AES-GCM-%3d #%d split (%s): ",(ulong)keybits,(ulong)(uint)ret,"dec");
      }
      mbedtls_gcm_setkey((mbedtls_gcm_context *)(buf + 0x38),MBEDTLS_CIPHER_ID_AES,
                         key[key_index[ret]],keybits);
      iVar26 = mbedtls_gcm_starts((mbedtls_gcm_context *)(buf + 0x38),0,iv[iv_index[ret]],
                                  iv_len[ret],additional[add_index[ret]],add_len[ret]);
      if (iVar26 != 0) {
        if (verbose != 0) {
          printf("failed\n");
        }
        return 1;
      }
      if (pt_len[ret] < 0x21) {
        iVar26 = mbedtls_gcm_update((mbedtls_gcm_context *)(buf + 0x38),pt_len[ret],
                                    ct[(int)(cipher * 6 + ret)],tag_buf + 8);
        if (iVar26 != 0) {
          if (verbose != 0) {
            printf("failed\n");
          }
          return 1;
        }
      }
      else {
        sVar1 = pt_len[ret];
        iVar26 = mbedtls_gcm_update((mbedtls_gcm_context *)(buf + 0x38),0x20,
                                    ct[(int)(cipher * 6 + ret)],tag_buf + 8);
        if (iVar26 != 0) {
          if (verbose != 0) {
            printf("failed\n");
          }
          return 1;
        }
        iVar26 = mbedtls_gcm_update((mbedtls_gcm_context *)(buf + 0x38),sVar1 - 0x20,
                                    ct[(int)(cipher * 6 + ret)] + 0x20,buf + 0x18);
        if (iVar26 != 0) {
          if (verbose != 0) {
            printf("failed\n");
          }
          return 1;
        }
      }
      iVar26 = mbedtls_gcm_finish((mbedtls_gcm_context *)(buf + 0x38),(uchar *)&j,0x10);
      if ((iVar26 != 0) ||
         (iVar26 = memcmp(tag_buf + 8,pt + pt_index[ret],pt_len[ret]), iVar26 != 0)) {
LAB_0013e175:
        if (verbose != 0) {
          printf("failed\n");
        }
        return 1;
      }
      iVar26 = cipher * 6 + ret;
      cVar27 = -((uchar)j == tag[iVar26][0]);
      cVar28 = -(j._1_1_ == tag[iVar26][1]);
      cVar29 = -(j._2_1_ == tag[iVar26][2]);
      cVar30 = -(j._3_1_ == tag[iVar26][3]);
      cVar31 = -((uchar)i == tag[iVar26][4]);
      cVar32 = -(i._1_1_ == tag[iVar26][5]);
      cVar33 = -(i._2_1_ == tag[iVar26][6]);
      cVar34 = -(i._3_1_ == tag[iVar26][7]);
      cVar35 = -(tag_buf[0] == tag[iVar26][8]);
      cVar36 = -(tag_buf[1] == tag[iVar26][9]);
      cVar37 = -(tag_buf[2] == tag[iVar26][10]);
      cVar38 = -(tag_buf[3] == tag[iVar26][0xb]);
      cVar39 = -(tag_buf[4] == tag[iVar26][0xc]);
      cVar40 = -(tag_buf[5] == tag[iVar26][0xd]);
      cVar41 = -(tag_buf[6] == tag[iVar26][0xe]);
      bVar42 = -(tag_buf[7] == tag[iVar26][0xf]);
      auVar8[1] = cVar28;
      auVar8[0] = cVar27;
      auVar8[2] = cVar29;
      auVar8[3] = cVar30;
      auVar8[4] = cVar31;
      auVar8[5] = cVar32;
      auVar8[6] = cVar33;
      auVar8[7] = cVar34;
      auVar8[8] = cVar35;
      auVar8[9] = cVar36;
      auVar8[10] = cVar37;
      auVar8[0xb] = cVar38;
      auVar8[0xc] = cVar39;
      auVar8[0xd] = cVar40;
      auVar8[0xe] = cVar41;
      auVar8[0xf] = bVar42;
      auVar9[1] = cVar28;
      auVar9[0] = cVar27;
      auVar9[2] = cVar29;
      auVar9[3] = cVar30;
      auVar9[4] = cVar31;
      auVar9[5] = cVar32;
      auVar9[6] = cVar33;
      auVar9[7] = cVar34;
      auVar9[8] = cVar35;
      auVar9[9] = cVar36;
      auVar9[10] = cVar37;
      auVar9[0xb] = cVar38;
      auVar9[0xc] = cVar39;
      auVar9[0xd] = cVar40;
      auVar9[0xe] = cVar41;
      auVar9[0xf] = bVar42;
      auVar25[1] = cVar30;
      auVar25[0] = cVar29;
      auVar25[2] = cVar31;
      auVar25[3] = cVar32;
      auVar25[4] = cVar33;
      auVar25[5] = cVar34;
      auVar25[6] = cVar35;
      auVar25[7] = cVar36;
      auVar25[8] = cVar37;
      auVar25[9] = cVar38;
      auVar25[10] = cVar39;
      auVar25[0xb] = cVar40;
      auVar25[0xc] = cVar41;
      auVar25[0xd] = bVar42;
      auVar21[1] = cVar31;
      auVar21[0] = cVar30;
      auVar21[2] = cVar32;
      auVar21[3] = cVar33;
      auVar21[4] = cVar34;
      auVar21[5] = cVar35;
      auVar21[6] = cVar36;
      auVar21[7] = cVar37;
      auVar21[8] = cVar38;
      auVar21[9] = cVar39;
      auVar21[10] = cVar40;
      auVar21[0xb] = cVar41;
      auVar21[0xc] = bVar42;
      auVar17[1] = cVar32;
      auVar17[0] = cVar31;
      auVar17[2] = cVar33;
      auVar17[3] = cVar34;
      auVar17[4] = cVar35;
      auVar17[5] = cVar36;
      auVar17[6] = cVar37;
      auVar17[7] = cVar38;
      auVar17[8] = cVar39;
      auVar17[9] = cVar40;
      auVar17[10] = cVar41;
      auVar17[0xb] = bVar42;
      auVar13[1] = cVar33;
      auVar13[0] = cVar32;
      auVar13[2] = cVar34;
      auVar13[3] = cVar35;
      auVar13[4] = cVar36;
      auVar13[5] = cVar37;
      auVar13[6] = cVar38;
      auVar13[7] = cVar39;
      auVar13[8] = cVar40;
      auVar13[9] = cVar41;
      auVar13[10] = bVar42;
      if ((ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) | (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB141(auVar25 >> 7,0) & 1) << 2 |
                   (ushort)(SUB131(auVar21 >> 7,0) & 1) << 3 |
                   (ushort)(SUB121(auVar17 >> 7,0) & 1) << 4 |
                   (ushort)(SUB111(auVar13 >> 7,0) & 1) << 5 |
                   (ushort)((byte)(CONCAT19(bVar42,CONCAT18(cVar41,CONCAT17(cVar40,CONCAT16(cVar39,
                                                  CONCAT15(cVar38,CONCAT14(cVar37,CONCAT13(cVar36,
                                                  CONCAT12(cVar35,CONCAT11(cVar34,cVar33))))))))) >>
                                  7) & 1) << 6 |
                   (ushort)((byte)(CONCAT18(bVar42,CONCAT17(cVar41,CONCAT16(cVar40,CONCAT15(cVar39,
                                                  CONCAT14(cVar38,CONCAT13(cVar37,CONCAT12(cVar36,
                                                  CONCAT11(cVar35,cVar34)))))))) >> 7) & 1) << 7 |
                  (ushort)(bVar42 >> 7) << 0xf) != 0xffff) goto LAB_0013e175;
      mbedtls_gcm_free((mbedtls_gcm_context *)(buf + 0x38));
      if (verbose != 0) {
        printf("passed\n");
      }
    }
    cipher = cipher + MBEDTLS_CIPHER_ID_NULL;
  } while( true );
}

Assistant:

int mbedtls_gcm_self_test( int verbose )
{
    mbedtls_gcm_context ctx;
    unsigned char buf[64];
    unsigned char tag_buf[16];
    int i, j, ret;
    mbedtls_cipher_id_t cipher = MBEDTLS_CIPHER_ID_AES;

    mbedtls_gcm_init( &ctx );

    for( j = 0; j < 3; j++ )
    {
        int key_len = 128 + 64 * j;

        for( i = 0; i < MAX_TESTS; i++ )
        {
            if( verbose != 0 )
                mbedtls_printf( "  AES-GCM-%3d #%d (%s): ",
                                 key_len, i, "enc" );

            mbedtls_gcm_setkey( &ctx, cipher, key[key_index[i]], key_len );

            ret = mbedtls_gcm_crypt_and_tag( &ctx, MBEDTLS_GCM_ENCRYPT,
                                     pt_len[i],
                                     iv[iv_index[i]], iv_len[i],
                                     additional[add_index[i]], add_len[i],
                                     pt[pt_index[i]], buf, 16, tag_buf );

            if( ret != 0 ||
                memcmp( buf, ct[j * 6 + i], pt_len[i] ) != 0 ||
                memcmp( tag_buf, tag[j * 6 + i], 16 ) != 0 )
            {
                if( verbose != 0 )
                    mbedtls_printf( "failed\n" );

                return( 1 );
            }

            mbedtls_gcm_free( &ctx );

            if( verbose != 0 )
                mbedtls_printf( "passed\n" );

            if( verbose != 0 )
                mbedtls_printf( "  AES-GCM-%3d #%d (%s): ",
                                 key_len, i, "dec" );

            mbedtls_gcm_setkey( &ctx, cipher, key[key_index[i]], key_len );

            ret = mbedtls_gcm_crypt_and_tag( &ctx, MBEDTLS_GCM_DECRYPT,
                                     pt_len[i],
                                     iv[iv_index[i]], iv_len[i],
                                     additional[add_index[i]], add_len[i],
                                     ct[j * 6 + i], buf, 16, tag_buf );

            if( ret != 0 ||
                memcmp( buf, pt[pt_index[i]], pt_len[i] ) != 0 ||
                memcmp( tag_buf, tag[j * 6 + i], 16 ) != 0 )
            {
                if( verbose != 0 )
                    mbedtls_printf( "failed\n" );

                return( 1 );
            }

            mbedtls_gcm_free( &ctx );

            if( verbose != 0 )
                mbedtls_printf( "passed\n" );

            if( verbose != 0 )
                mbedtls_printf( "  AES-GCM-%3d #%d split (%s): ",
                                 key_len, i, "enc" );

            mbedtls_gcm_setkey( &ctx, cipher, key[key_index[i]], key_len );

            ret = mbedtls_gcm_starts( &ctx, MBEDTLS_GCM_ENCRYPT,
                              iv[iv_index[i]], iv_len[i],
                              additional[add_index[i]], add_len[i] );
            if( ret != 0 )
            {
                if( verbose != 0 )
                    mbedtls_printf( "failed\n" );

                return( 1 );
            }

            if( pt_len[i] > 32 )
            {
                size_t rest_len = pt_len[i] - 32;
                ret = mbedtls_gcm_update( &ctx, 32, pt[pt_index[i]], buf );
                if( ret != 0 )
                {
                    if( verbose != 0 )
                        mbedtls_printf( "failed\n" );

                    return( 1 );
                }

                ret = mbedtls_gcm_update( &ctx, rest_len, pt[pt_index[i]] + 32,
                                  buf + 32 );
                if( ret != 0 )
                {
                    if( verbose != 0 )
                        mbedtls_printf( "failed\n" );

                    return( 1 );
                }
            }
            else
            {
                ret = mbedtls_gcm_update( &ctx, pt_len[i], pt[pt_index[i]], buf );
                if( ret != 0 )
                {
                    if( verbose != 0 )
                        mbedtls_printf( "failed\n" );

                    return( 1 );
                }
            }

            ret = mbedtls_gcm_finish( &ctx, tag_buf, 16 );
            if( ret != 0 ||
                memcmp( buf, ct[j * 6 + i], pt_len[i] ) != 0 ||
                memcmp( tag_buf, tag[j * 6 + i], 16 ) != 0 )
            {
                if( verbose != 0 )
                    mbedtls_printf( "failed\n" );

                return( 1 );
            }

            mbedtls_gcm_free( &ctx );

            if( verbose != 0 )
                mbedtls_printf( "passed\n" );

            if( verbose != 0 )
                mbedtls_printf( "  AES-GCM-%3d #%d split (%s): ",
                                 key_len, i, "dec" );

            mbedtls_gcm_setkey( &ctx, cipher, key[key_index[i]], key_len );

            ret = mbedtls_gcm_starts( &ctx, MBEDTLS_GCM_DECRYPT,
                              iv[iv_index[i]], iv_len[i],
                              additional[add_index[i]], add_len[i] );
            if( ret != 0 )
            {
                if( verbose != 0 )
                    mbedtls_printf( "failed\n" );

                return( 1 );
            }

            if( pt_len[i] > 32 )
            {
                size_t rest_len = pt_len[i] - 32;
                ret = mbedtls_gcm_update( &ctx, 32, ct[j * 6 + i], buf );
                if( ret != 0 )
                {
                    if( verbose != 0 )
                        mbedtls_printf( "failed\n" );

                    return( 1 );
                }

                ret = mbedtls_gcm_update( &ctx, rest_len, ct[j * 6 + i] + 32,
                                  buf + 32 );
                if( ret != 0 )
                {
                    if( verbose != 0 )
                        mbedtls_printf( "failed\n" );

                    return( 1 );
                }
            }
            else
            {
                ret = mbedtls_gcm_update( &ctx, pt_len[i], ct[j * 6 + i], buf );
                if( ret != 0 )
                {
                    if( verbose != 0 )
                        mbedtls_printf( "failed\n" );

                    return( 1 );
                }
            }

            ret = mbedtls_gcm_finish( &ctx, tag_buf, 16 );
            if( ret != 0 ||
                memcmp( buf, pt[pt_index[i]], pt_len[i] ) != 0 ||
                memcmp( tag_buf, tag[j * 6 + i], 16 ) != 0 )
            {
                if( verbose != 0 )
                    mbedtls_printf( "failed\n" );

                return( 1 );
            }

            mbedtls_gcm_free( &ctx );

            if( verbose != 0 )
                mbedtls_printf( "passed\n" );

        }
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );

    return( 0 );
}